

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

CollectionInstance * __thiscall
tinyusdz::ordered_dict<tinyusdz::CollectionInstance>::get_or_add
          (ordered_dict<tinyusdz::CollectionInstance> *this,string *key)

{
  size_type sVar1;
  mapped_type *pmVar2;
  
  sVar1 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>_>_>
          ::count(&this->_m,key);
  if (sVar1 == 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->_keys,key);
  }
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::CollectionInstance>_>_>
           ::operator[](&this->_m,key);
  return pmVar2;
}

Assistant:

T &get_or_add(const std::string &key) {
    if (!_m.count(key)) {
      _keys.push_back(key);
    }

    return _m[key];
  }